

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O2

void agg::qsort_cells<agg::cell_aa>(cell_aa **start,uint num)

{
  int *piVar1;
  int *piVar2;
  cell_aa *temp_3;
  cell_aa *pcVar3;
  cell_aa **ppcVar4;
  int iVar5;
  int iVar6;
  cell_aa **ppcVar7;
  cell_aa **ppcVar8;
  cell_aa **ppcVar9;
  ulong *puVar10;
  ulong uVar11;
  cell_aa **ppcVar12;
  cell_aa *temp_1;
  cell_aa *pcVar13;
  cell_aa *pcVar14;
  long lVar15;
  cell_aa *temp;
  long lVar16;
  cell_aa *temp_2;
  ulong local_2b8 [81];
  
  ppcVar7 = start + num;
  puVar10 = local_2b8;
  do {
    while (9 < (int)((ulong)((long)ppcVar7 - (long)start) >> 3)) {
      uVar11 = (ulong)((long)ppcVar7 - (long)start) >> 1 & 0x3fffffff8;
      pcVar14 = *start;
      *start = *(cell_aa **)((long)start + uVar11);
      *(cell_aa **)((long)start + uVar11) = pcVar14;
      ppcVar12 = start + 1;
      ppcVar8 = ppcVar7 + -1;
      pcVar3 = ppcVar7[-1];
      pcVar14 = start[1];
      iVar5 = pcVar14->x;
      pcVar13 = pcVar14;
      if (pcVar3->x < iVar5) {
        *ppcVar12 = pcVar3;
        *ppcVar8 = pcVar14;
        pcVar13 = *ppcVar12;
        iVar5 = pcVar13->x;
        pcVar3 = pcVar14;
      }
      pcVar14 = *start;
      iVar6 = pcVar14->x;
      if (iVar6 < iVar5) {
        *start = pcVar13;
        start[1] = pcVar14;
        pcVar3 = *ppcVar8;
        pcVar14 = pcVar13;
        iVar6 = iVar5;
      }
      if (pcVar3->x < iVar6) {
        *start = pcVar3;
        *ppcVar8 = pcVar14;
      }
      while( true ) {
        pcVar14 = *start;
        iVar5 = pcVar14->x;
        lVar16 = (long)ppcVar7 - (long)ppcVar12;
        do {
          pcVar13 = ppcVar12[1];
          ppcVar12 = ppcVar12 + 1;
          lVar16 = lVar16 + -8;
        } while (pcVar13->x < iVar5);
        lVar15 = (long)ppcVar8 - (long)start;
        do {
          pcVar3 = ppcVar8[-1];
          ppcVar8 = ppcVar8 + -1;
          lVar15 = lVar15 + -8;
        } while (iVar5 < pcVar3->x);
        if (ppcVar8 < ppcVar12) break;
        *ppcVar12 = pcVar3;
        *ppcVar8 = pcVar13;
      }
      *start = pcVar3;
      *ppcVar8 = pcVar14;
      ppcVar4 = ppcVar7;
      ppcVar9 = start;
      if (lVar16 < lVar15) {
        ppcVar4 = ppcVar8;
        ppcVar8 = ppcVar7;
        ppcVar9 = ppcVar12;
        ppcVar12 = start;
      }
      *puVar10 = (ulong)ppcVar12;
      puVar10[1] = (ulong)ppcVar4;
      puVar10 = puVar10 + 2;
      ppcVar7 = ppcVar8;
      start = ppcVar9;
    }
    lVar16 = 0;
    while (start + 1 < ppcVar7) {
      lVar15 = 8;
      do {
        piVar1 = *(int **)((long)start + lVar15 + -8);
        piVar2 = *(int **)((long)start + lVar15);
        if (*piVar1 <= *piVar2) break;
        *(int **)((long)start + lVar15) = piVar1;
        *(int **)((long)start + lVar15 + -8) = piVar2;
        lVar15 = lVar15 + -8;
      } while (lVar16 != lVar15);
      lVar16 = lVar16 + -8;
      start = start + 1;
    }
    if (puVar10 <= local_2b8) {
      return;
    }
    start = (cell_aa **)puVar10[-2];
    ppcVar7 = (cell_aa **)puVar10[-1];
    puVar10 = puVar10 + -2;
  } while( true );
}

Assistant:

void qsort_cells(Cell** start, unsigned num)
    {
        Cell**  stack[80];
        Cell*** top; 
        Cell**  limit;
        Cell**  base;

        limit = start + num;
        base  = start;
        top   = stack;

        for (;;)
        {
            int len = int(limit - base);

            Cell** i;
            Cell** j;
            Cell** pivot;

            if(len > qsort_threshold)
            {
                // we use base + len/2 as the pivot
                pivot = base + len / 2;
                swap_cells(base, pivot);

                i = base + 1;
                j = limit - 1;

                // now ensure that *i <= *base <= *j 
                if((*j)->x < (*i)->x)
                {
                    swap_cells(i, j);
                }

                if((*base)->x < (*i)->x)
                {
                    swap_cells(base, i);
                }

                if((*j)->x < (*base)->x)
                {
                    swap_cells(base, j);
                }

                for(;;)
                {
                    int x = (*base)->x;
                    do i++; while( (*i)->x < x );
                    do j--; while( x < (*j)->x );

                    if(i > j)
                    {
                        break;
                    }

                    swap_cells(i, j);
                }

                swap_cells(base, j);

                // now, push the largest sub-array
                if(j - base > limit - i)
                {
                    top[0] = base;
                    top[1] = j;
                    base   = i;
                }
                else
                {
                    top[0] = i;
                    top[1] = limit;
                    limit  = j;
                }
                top += 2;
            }
            else
            {
                // the sub-array is small, perform insertion sort
                j = base;
                i = j + 1;

                for(; i < limit; j = i, i++)
                {
                    for(; j[1]->x < (*j)->x; j--)
                    {
                        swap_cells(j + 1, j);
                        if (j == base)
                        {
                            break;
                        }
                    }
                }

                if(top > stack)
                {
                    top  -= 2;
                    base  = top[0];
                    limit = top[1];
                }
                else
                {
                    break;
                }
            }
        }
    }